

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_tags.cpp
# Opt level: O2

void __thiscall FTagManager::HashTags(FTagManager *this)

{
  int *__s;
  byte bVar1;
  FTagItem *pFVar2;
  uint uVar3;
  uint uVar4;
  
  TArray<FTagItem,_FTagItem>::Push(&this->allTags,&HashTags::it);
  TArray<FTagItem,_FTagItem>::Push(&this->allIDs,&HashTags::it);
  __s = this->TagHashFirst;
  memset(__s,0xff,0x800);
  uVar3 = (this->allTags).Count;
  pFVar2 = (this->allTags).Array;
  while( true ) {
    uVar3 = uVar3 - 1;
    if ((int)uVar3 < 0) break;
    uVar4 = uVar3 & 0x7fffffff;
    if (-1 < pFVar2[uVar4].target) {
      bVar1 = (byte)pFVar2[uVar4].tag;
      pFVar2[uVar4].nexttag = __s[bVar1];
      __s[bVar1] = uVar3;
    }
  }
  uVar3 = (this->allIDs).Count;
  pFVar2 = (this->allIDs).Array;
  while( true ) {
    uVar3 = uVar3 - 1;
    if ((int)uVar3 < 0) break;
    uVar4 = uVar3 & 0x7fffffff;
    if (-1 < pFVar2[uVar4].target) {
      bVar1 = (byte)pFVar2[uVar4].tag;
      pFVar2[uVar4].nexttag = this->IDHashFirst[bVar1];
      this->IDHashFirst[bVar1] = uVar3;
    }
  }
  return;
}

Assistant:

void FTagManager::HashTags()
{
	// add an end marker so we do not need to check for the array's size in the other functions.
	static FTagItem it = { -1, -1, -1 };
	allTags.Push(it);
	allIDs.Push(it);

	// Initially make all slots empty.
	memset(TagHashFirst, -1, sizeof(TagHashFirst));
	memset(IDHashFirst, -1, sizeof(IDHashFirst));

	// Proceed from last to first so that lower targets appear first
	for (int i = allTags.Size() - 1; i >= 0; i--)
	{
		if (allTags[i].target >= 0)	// only link valid entries
		{
			int hash = ((unsigned int)allTags[i].tag) % FTagManager::TAG_HASH_SIZE;
			allTags[i].nexttag = TagHashFirst[hash];
			TagHashFirst[hash] = i;
		}
	}

	for (int i = allIDs.Size() - 1; i >= 0; i--)
	{
		if (allIDs[i].target >= 0)	// only link valid entries
		{
			int hash = ((unsigned int)allIDs[i].tag) % FTagManager::TAG_HASH_SIZE;
			allIDs[i].nexttag = IDHashFirst[hash];
			IDHashFirst[hash] = i;
		}
	}

}